

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrsv.c
# Opt level: O0

void ctrsv_(char *uplo,char *trans,char *diag,integer *n,singlecomplex *a,integer *lda,
           singlecomplex *x,integer *incx)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int local_80;
  logical nounit;
  logical noconj;
  integer kx;
  integer jx;
  integer ix;
  integer j;
  integer i;
  singlecomplex temp;
  integer info;
  singlecomplex q__3;
  singlecomplex q__2;
  singlecomplex q__1;
  integer *lda_local;
  singlecomplex *a_local;
  integer *n_local;
  char *diag_local;
  char *trans_local;
  char *uplo_local;
  
  temp.r = 0.0;
  iVar1 = strncmp(uplo,"U",1);
  if ((iVar1 == 0) || (iVar1 = strncmp(uplo,"L",1), iVar1 == 0)) {
    iVar1 = strncmp(trans,"N",1);
    if ((iVar1 == 0) ||
       ((iVar1 = strncmp(trans,"T",1), iVar1 == 0 || (iVar1 = strncmp(trans,"C",1), iVar1 == 0)))) {
      iVar1 = strncmp(diag,"U",1);
      if ((iVar1 == 0) || (iVar1 = strncmp(diag,"N",1), iVar1 == 0)) {
        if (*n < 0) {
          temp.r = 5.60519e-45;
        }
        else {
          if (*n < 2) {
            local_80 = 1;
          }
          else {
            local_80 = *n;
          }
          if (*lda < local_80) {
            temp.r = 8.40779e-45;
          }
          else if (*incx == 0) {
            temp.r = 1.12104e-44;
          }
        }
      }
      else {
        temp.r = 4.2039e-45;
      }
    }
    else {
      temp.r = 2.8026e-45;
    }
  }
  else {
    temp.r = 1.4013e-45;
  }
  if (temp.r == 0.0) {
    if (*n != 0) {
      iVar1 = strncmp(trans,"T",1);
      bVar2 = iVar1 != 0;
      iVar1 = strncmp(diag,"N",1);
      bVar3 = iVar1 == 0;
      if (*incx < 1) {
        nounit = 1 - (*n + -1) * *incx;
      }
      else if (*incx != 1) {
        nounit = 1;
      }
      iVar1 = strncmp(trans,"N",1);
      if (iVar1 == 0) {
        iVar1 = strncmp(uplo,"U",1);
        if (iVar1 == 0) {
          if (*incx == 1) {
            for (jx = *n; 0 < jx; jx = jx + -1) {
              if (((x[jx + -1].r != 0.0) || (x[jx + -1].i != 0.0)) || (NAN(x[jx + -1].i))) {
                if (bVar3) {
                  c_div(&q__2,x + (jx + -1),a + (jx + -1 + (jx + -1) * *lda));
                  x[jx + -1].r = q__2.r;
                  x[jx + -1].i = q__2.i;
                }
                j = (integer)x[jx + -1].r;
                i = (integer)x[jx + -1].i;
                iVar1 = jx;
                while (ix = iVar1 + -1, 0 < ix) {
                  q__3.r = (float)j * a[iVar1 + -2 + (jx + -1) * *lda].r +
                           -((float)i * a[iVar1 + -2 + (jx + -1) * *lda].i);
                  q__3.i = (float)j * a[iVar1 + -2 + (jx + -1) * *lda].i +
                           (float)i * a[iVar1 + -2 + (jx + -1) * *lda].r;
                  q__2.r = x[iVar1 + -2].r - q__3.r;
                  q__2.i = x[iVar1 + -2].i - q__3.i;
                  x[iVar1 + -2].r = q__2.r;
                  x[iVar1 + -2].i = q__2.i;
                  iVar1 = ix;
                }
              }
            }
          }
          else {
            noconj = nounit + (*n + -1) * *incx;
            for (jx = *n; 0 < jx; jx = jx + -1) {
              if (((x[noconj + -1].r != 0.0) || (x[noconj + -1].i != 0.0)) ||
                 (NAN(x[noconj + -1].i))) {
                if (bVar3) {
                  c_div(&q__2,x + (noconj + -1),a + (jx + -1 + (jx + -1) * *lda));
                  x[noconj + -1].r = q__2.r;
                  x[noconj + -1].i = q__2.i;
                }
                j = (integer)x[noconj + -1].r;
                i = (integer)x[noconj + -1].i;
                kx = noconj;
                iVar1 = jx;
                while (ix = iVar1 + -1, 0 < ix) {
                  kx = kx - *incx;
                  q__3.r = (float)j * a[iVar1 + -2 + (jx + -1) * *lda].r +
                           -((float)i * a[iVar1 + -2 + (jx + -1) * *lda].i);
                  q__3.i = (float)j * a[iVar1 + -2 + (jx + -1) * *lda].i +
                           (float)i * a[iVar1 + -2 + (jx + -1) * *lda].r;
                  q__2.r = x[kx + -1].r - q__3.r;
                  q__2.i = x[kx + -1].i - q__3.i;
                  x[kx + -1].r = q__2.r;
                  x[kx + -1].i = q__2.i;
                  iVar1 = ix;
                }
              }
              noconj = noconj - *incx;
            }
          }
        }
        else if (*incx == 1) {
          for (jx = 1; jx <= *n; jx = jx + 1) {
            if (((x[jx + -1].r != 0.0) || (x[jx + -1].i != 0.0)) || (NAN(x[jx + -1].i))) {
              if (bVar3) {
                c_div(&q__2,x + (jx + -1),a + (jx + -1 + (jx + -1) * *lda));
                x[jx + -1].r = q__2.r;
                x[jx + -1].i = q__2.i;
              }
              j = (integer)x[jx + -1].r;
              i = (integer)x[jx + -1].i;
              iVar1 = jx;
              while (ix = iVar1 + 1, ix <= *n) {
                q__3.r = (float)j * a[iVar1 + (jx + -1) * *lda].r +
                         -((float)i * a[iVar1 + (jx + -1) * *lda].i);
                q__3.i = (float)j * a[iVar1 + (jx + -1) * *lda].i +
                         (float)i * a[iVar1 + (jx + -1) * *lda].r;
                q__2.r = x[iVar1].r - q__3.r;
                q__2.i = x[iVar1].i - q__3.i;
                x[iVar1].r = q__2.r;
                x[iVar1].i = q__2.i;
                iVar1 = ix;
              }
            }
          }
        }
        else {
          noconj = nounit;
          for (jx = 1; jx <= *n; jx = jx + 1) {
            if (((x[noconj + -1].r != 0.0) || (x[noconj + -1].i != 0.0)) || (NAN(x[noconj + -1].i)))
            {
              if (bVar3) {
                c_div(&q__2,x + (noconj + -1),a + (jx + -1 + (jx + -1) * *lda));
                x[noconj + -1].r = q__2.r;
                x[noconj + -1].i = q__2.i;
              }
              j = (integer)x[noconj + -1].r;
              i = (integer)x[noconj + -1].i;
              kx = noconj;
              iVar1 = jx;
              while (ix = iVar1 + 1, ix <= *n) {
                kx = *incx + kx;
                q__3.r = (float)j * a[iVar1 + (jx + -1) * *lda].r +
                         -((float)i * a[iVar1 + (jx + -1) * *lda].i);
                q__3.i = (float)j * a[iVar1 + (jx + -1) * *lda].i +
                         (float)i * a[iVar1 + (jx + -1) * *lda].r;
                q__2.r = x[kx + -1].r - q__3.r;
                q__2.i = x[kx + -1].i - q__3.i;
                x[kx + -1].r = q__2.r;
                x[kx + -1].i = q__2.i;
                iVar1 = ix;
              }
            }
            noconj = *incx + noconj;
          }
        }
      }
      else {
        iVar1 = strncmp(uplo,"U",1);
        if (iVar1 == 0) {
          if (*incx == 1) {
            for (jx = 1; jx <= *n; jx = jx + 1) {
              j = (integer)x[jx + -1].r;
              i = (integer)x[jx + -1].i;
              if (bVar2) {
                for (ix = 1; ix <= jx + -1; ix = ix + 1) {
                  r_cnjg((singlecomplex *)&temp.i,a + (ix + -1 + (jx + -1) * *lda));
                  q__3.r = temp.i * x[ix + -1].r + -((float)info * x[ix + -1].i);
                  q__3.i = temp.i * x[ix + -1].i + (float)info * x[ix + -1].r;
                  j = (integer)((float)j - q__3.r);
                  i = (integer)((float)i - q__3.i);
                  q__2.r = (float)j;
                  q__2.i = (float)i;
                }
                if (bVar3) {
                  r_cnjg(&q__3,a + (jx + -1 + (jx + -1) * *lda));
                  c_div(&q__2,(singlecomplex *)&j,&q__3);
                  j = (integer)q__2.r;
                  i = (integer)q__2.i;
                }
              }
              else {
                for (ix = 1; ix <= jx + -1; ix = ix + 1) {
                  q__3.r = a[ix + -1 + (jx + -1) * *lda].r * x[ix + -1].r +
                           -(a[ix + -1 + (jx + -1) * *lda].i * x[ix + -1].i);
                  q__3.i = a[ix + -1 + (jx + -1) * *lda].r * x[ix + -1].i +
                           a[ix + -1 + (jx + -1) * *lda].i * x[ix + -1].r;
                  j = (integer)((float)j - q__3.r);
                  i = (integer)((float)i - q__3.i);
                  q__2.r = (float)j;
                  q__2.i = (float)i;
                }
                if (bVar3) {
                  c_div(&q__2,(singlecomplex *)&j,a + (jx + -1 + (jx + -1) * *lda));
                  j = (integer)q__2.r;
                  i = (integer)q__2.i;
                }
              }
              x[jx + -1].r = (float)j;
              x[jx + -1].i = (float)i;
            }
          }
          else {
            noconj = nounit;
            for (jx = 1; jx <= *n; jx = jx + 1) {
              kx = nounit;
              j = (integer)x[noconj + -1].r;
              i = (integer)x[noconj + -1].i;
              if (bVar2) {
                for (ix = 1; ix <= jx + -1; ix = ix + 1) {
                  r_cnjg((singlecomplex *)&temp.i,a + (ix + -1 + (jx + -1) * *lda));
                  q__3.r = temp.i * x[kx + -1].r + -((float)info * x[kx + -1].i);
                  q__3.i = temp.i * x[kx + -1].i + (float)info * x[kx + -1].r;
                  j = (integer)((float)j - q__3.r);
                  i = (integer)((float)i - q__3.i);
                  kx = *incx + kx;
                  q__2.r = (float)j;
                  q__2.i = (float)i;
                }
                if (bVar3) {
                  r_cnjg(&q__3,a + (jx + -1 + (jx + -1) * *lda));
                  c_div(&q__2,(singlecomplex *)&j,&q__3);
                  j = (integer)q__2.r;
                  i = (integer)q__2.i;
                }
              }
              else {
                for (ix = 1; ix <= jx + -1; ix = ix + 1) {
                  q__3.r = a[ix + -1 + (jx + -1) * *lda].r * x[kx + -1].r +
                           -(a[ix + -1 + (jx + -1) * *lda].i * x[kx + -1].i);
                  q__3.i = a[ix + -1 + (jx + -1) * *lda].r * x[kx + -1].i +
                           a[ix + -1 + (jx + -1) * *lda].i * x[kx + -1].r;
                  j = (integer)((float)j - q__3.r);
                  i = (integer)((float)i - q__3.i);
                  kx = *incx + kx;
                  q__2.r = (float)j;
                  q__2.i = (float)i;
                }
                if (bVar3) {
                  c_div(&q__2,(singlecomplex *)&j,a + (jx + -1 + (jx + -1) * *lda));
                  j = (integer)q__2.r;
                  i = (integer)q__2.i;
                }
              }
              x[noconj + -1].r = (float)j;
              x[noconj + -1].i = (float)i;
              noconj = *incx + noconj;
            }
          }
        }
        else if (*incx == 1) {
          for (jx = *n; 0 < jx; jx = jx + -1) {
            j = (integer)x[jx + -1].r;
            i = (integer)x[jx + -1].i;
            if (bVar2) {
              for (ix = *n; jx + 1 <= ix; ix = ix + -1) {
                r_cnjg((singlecomplex *)&temp.i,a + (ix + -1 + (jx + -1) * *lda));
                q__3.r = temp.i * x[ix + -1].r + -((float)info * x[ix + -1].i);
                q__3.i = temp.i * x[ix + -1].i + (float)info * x[ix + -1].r;
                j = (integer)((float)j - q__3.r);
                i = (integer)((float)i - q__3.i);
                q__2.r = (float)j;
                q__2.i = (float)i;
              }
              if (bVar3) {
                r_cnjg(&q__3,a + (jx + -1 + (jx + -1) * *lda));
                c_div(&q__2,(singlecomplex *)&j,&q__3);
                j = (integer)q__2.r;
                i = (integer)q__2.i;
              }
            }
            else {
              for (ix = *n; jx + 1 <= ix; ix = ix + -1) {
                q__3.r = a[ix + -1 + (jx + -1) * *lda].r * x[ix + -1].r +
                         -(a[ix + -1 + (jx + -1) * *lda].i * x[ix + -1].i);
                q__3.i = a[ix + -1 + (jx + -1) * *lda].r * x[ix + -1].i +
                         a[ix + -1 + (jx + -1) * *lda].i * x[ix + -1].r;
                j = (integer)((float)j - q__3.r);
                i = (integer)((float)i - q__3.i);
                q__2.r = (float)j;
                q__2.i = (float)i;
              }
              if (bVar3) {
                c_div(&q__2,(singlecomplex *)&j,a + (jx + -1 + (jx + -1) * *lda));
                j = (integer)q__2.r;
                i = (integer)q__2.i;
              }
            }
            x[jx + -1].r = (float)j;
            x[jx + -1].i = (float)i;
          }
        }
        else {
          iVar1 = (*n + -1) * *incx + nounit;
          noconj = iVar1;
          for (jx = *n; 0 < jx; jx = jx + -1) {
            j = (integer)x[noconj + -1].r;
            i = (integer)x[noconj + -1].i;
            kx = iVar1;
            if (bVar2) {
              for (ix = *n; jx + 1 <= ix; ix = ix + -1) {
                r_cnjg((singlecomplex *)&temp.i,a + (ix + -1 + (jx + -1) * *lda));
                q__3.r = temp.i * x[kx + -1].r + -((float)info * x[kx + -1].i);
                q__3.i = temp.i * x[kx + -1].i + (float)info * x[kx + -1].r;
                j = (integer)((float)j - q__3.r);
                i = (integer)((float)i - q__3.i);
                kx = kx - *incx;
                q__2.r = (float)j;
                q__2.i = (float)i;
              }
              if (bVar3) {
                r_cnjg(&q__3,a + (jx + -1 + (jx + -1) * *lda));
                c_div(&q__2,(singlecomplex *)&j,&q__3);
                j = (integer)q__2.r;
                i = (integer)q__2.i;
              }
            }
            else {
              for (ix = *n; jx + 1 <= ix; ix = ix + -1) {
                q__3.r = a[ix + -1 + (jx + -1) * *lda].r * x[kx + -1].r +
                         -(a[ix + -1 + (jx + -1) * *lda].i * x[kx + -1].i);
                q__3.i = a[ix + -1 + (jx + -1) * *lda].r * x[kx + -1].i +
                         a[ix + -1 + (jx + -1) * *lda].i * x[kx + -1].r;
                j = (integer)((float)j - q__3.r);
                i = (integer)((float)i - q__3.i);
                kx = kx - *incx;
                q__2.r = (float)j;
                q__2.i = (float)i;
              }
              if (bVar3) {
                c_div(&q__2,(singlecomplex *)&j,a + (jx + -1 + (jx + -1) * *lda));
                j = (integer)q__2.r;
                i = (integer)q__2.i;
              }
            }
            x[noconj + -1].r = (float)j;
            x[noconj + -1].i = (float)i;
            noconj = noconj - *incx;
          }
        }
      }
    }
  }
  else {
    input_error("CTRSV ",(int *)&temp);
  }
  return;
}

Assistant:

void ctrsv_(char *uplo, char *trans, char *diag, integer *n, 
	singlecomplex *a, integer *lda, singlecomplex *x, integer *incx)
{


    /* System generated locals */

    singlecomplex q__1, q__2, q__3;

    /* Builtin functions */
    void c_div(singlecomplex *, singlecomplex *, singlecomplex *), r_cnjg(singlecomplex *, singlecomplex *);

    /* Local variables */
    integer info;
    singlecomplex temp;
    integer i, j;
    integer ix, jx, kx;
    logical noconj, nounit;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    CTRSV  solves one of the systems of equations   

       A*x = b,   or   A'*x = b,   or   conjg( A' )*x = b,   

    where b and x are n element vectors and A is an n by n unit, or   
    non-unit, upper or lower triangular matrix.   

    No test for singularity or near-singularity is included in this   
    routine. Such tests must be performed before calling this routine.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the matrix is an upper or   
             lower triangular matrix as follows:   

                UPLO = 'U' or 'u'   A is an upper triangular matrix.   

                UPLO = 'L' or 'l'   A is a lower triangular matrix.   

             Unchanged on exit.   

    TRANS  - CHARACTER*1.   
             On entry, TRANS specifies the equations to be solved as   
             follows:   

                TRANS = 'N' or 'n'   A*x = b.   

                TRANS = 'T' or 't'   A'*x = b.   

                TRANS = 'C' or 'c'   conjg( A' )*x = b.   

             Unchanged on exit.   

    DIAG   - CHARACTER*1.   
             On entry, DIAG specifies whether or not A is unit   
             triangular as follows:   

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.   

                DIAG = 'N' or 'n'   A is not assumed to be unit   
                                    triangular.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    A      - COMPLEX          array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular matrix and the strictly lower triangular part of 
  
             A is not referenced.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular matrix and the strictly upper triangular part of 
  
             A is not referenced.   
             Note that when  DIAG = 'U' or 'u', the diagonal elements of 
  
             A are not referenced either, but are assumed to be unity.   
             Unchanged on exit.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   

    X      - COMPLEX          array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element right-hand side vector b. On exit, X is overwritten 
  
             with the solution vector x.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 &&
		strncmp(trans, "C", 1)!=0 ) {
	info = 2;
    } else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 ) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,*n)) {
	info = 6;
    } else if (*incx == 0) {
	info = 8;
    }
    if (info != 0) {
	input_error("CTRSV ", &info);
	return;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return;
    }

    noconj = (strncmp(trans, "T", 1)==0);
    nounit = (strncmp(diag, "N", 1)==0);

/*     Set up the start point in X if the increment is not unity. This   
       will be  ( N - 1 )*INCX  too small for descending loops. */

    if (*incx <= 0) {
	kx = 1 - (*n - 1) * *incx;
    } else if (*incx != 1) {
	kx = 1;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */

    if (strncmp(trans, "N", 1)==0) {

/*        Form  x := inv( A )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j - 1; i >= 1; --i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L10: */
			}
		    }
/* L20: */
		}
	    } else {
		jx = kx + (*n - 1) * *incx;
		for (j = *n; j >= 1; --j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j - 1; i >= 1; --i) {
			    ix -= *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L30: */
			}
		    }
		    jx -= *incx;
/* L40: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    if (X(j).r != 0.f || X(j).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(j), &A(j,j));
			    X(j).r = q__1.r, X(j).i = q__1.i;
			}
			temp.r = X(j).r, temp.i = X(j).i;
			for (i = j + 1; i <= *n; ++i) {
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(i).r - q__2.r, q__1.i = X(i).i - 
				    q__2.i;
			    X(i).r = q__1.r, X(i).i = q__1.i;
/* L50: */
			}
		    }
/* L60: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    if (X(jx).r != 0.f || X(jx).i != 0.f) {
			if (nounit) {
			    c_div(&q__1, &X(jx), &A(j,j));
			    X(jx).r = q__1.r, X(jx).i = q__1.i;
			}
			temp.r = X(jx).r, temp.i = X(jx).i;
			ix = jx;
			for (i = j + 1; i <= *n; ++i) {
			    ix += *incx;
			    q__2.r = temp.r * A(i,j).r - temp.i * A(i,j).i, 
				    q__2.i = temp.r * A(i,j).i + temp.i * A(i,j).r;
			    q__1.r = X(ix).r - q__2.r, q__1.i = X(ix).i - 
				    q__2.i;
			    X(ix).r = q__1.r, X(ix).i = q__1.i;
/* L70: */
			}
		    }
		    jx += *incx;
/* L80: */
		}
	    }
	}
    } else {

/*        Form  x := inv( A' )*x  or  x := inv( conjg( A' ) )*x. */

	if (strncmp(uplo, "U", 1)==0) {
	    if (*incx == 1) {
		for (j = 1; j <= *n; ++j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L90: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L100: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L110: */
		}
	    } else {
		jx = kx;
		for (j = 1; j <= *n; ++j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = 1; i <= j-1; ++i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L120: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = 1; i <= j-1; ++i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix += *incx;
/* L130: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx += *incx;
/* L140: */
		}
	    }
	} else {
	    if (*incx == 1) {
		for (j = *n; j >= 1; --j) {
		    temp.r = X(j).r, temp.i = X(j).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(i).r - A(i,j).i * X(
				    i).i, q__2.i = A(i,j).r * X(i).i + 
				    A(i,j).i * X(i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L150: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(i).r - q__3.i * X(i).i, 
				    q__2.i = q__3.r * X(i).i + q__3.i * X(
				    i).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
/* L160: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(j).r = temp.r, X(j).i = temp.i;
/* L170: */
		}
	    } else {
		kx += (*n - 1) * *incx;
		jx = kx;
		for (j = *n; j >= 1; --j) {
		    ix = kx;
		    temp.r = X(jx).r, temp.i = X(jx).i;
		    if (noconj) {
			for (i = *n; i >= j+1; --i) {
			    q__2.r = A(i,j).r * X(ix).r - A(i,j).i * X(
				    ix).i, q__2.i = A(i,j).r * X(ix).i + 
				    A(i,j).i * X(ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L180: */
			}
			if (nounit) {
			    c_div(&q__1, &temp, &A(j,j));
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    } else {
			for (i = *n; i >= j+1; --i) {
			    r_cnjg(&q__3, &A(i,j));
			    q__2.r = q__3.r * X(ix).r - q__3.i * X(ix).i, 
				    q__2.i = q__3.r * X(ix).i + q__3.i * X(
				    ix).r;
			    q__1.r = temp.r - q__2.r, q__1.i = temp.i - 
				    q__2.i;
			    temp.r = q__1.r, temp.i = q__1.i;
			    ix -= *incx;
/* L190: */
			}
			if (nounit) {
			    r_cnjg(&q__2, &A(j,j));
			    c_div(&q__1, &temp, &q__2);
			    temp.r = q__1.r, temp.i = q__1.i;
			}
		    }
		    X(jx).r = temp.r, X(jx).i = temp.i;
		    jx -= *incx;
/* L200: */
		}
	    }
	}
    }

    return;

/*     End of CTRSV . */

}